

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O1

int __thiscall
miniros::TransportTCP::connect(TransportTCP *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  pointer pcVar1;
  socket_fd_t *__addr_00;
  addrinfo *paVar2;
  ushort uVar3;
  bool bVar4;
  int iVar5;
  socklen_t sVar6;
  ostream *poVar7;
  undefined7 extraout_var;
  socklen_t extraout_EDX;
  socklen_t sVar8;
  socklen_t extraout_EDX_00;
  socklen_t extraout_EDX_01;
  socklen_t extraout_EDX_02;
  socklen_t extraout_EDX_03;
  socklen_t extraout_EDX_04;
  socklen_t extraout_EDX_05;
  socklen_t extraout_EDX_06;
  socklen_t extraout_EDX_07;
  socklen_t extraout_EDX_08;
  socklen_t extraout_EDX_09;
  socklen_t extraout_EDX_10;
  socklen_t extraout_EDX_11;
  socklen_t extraout_EDX_12;
  socklen_t extraout_EDX_13;
  socklen_t extraout_EDX_14;
  socklen_t extraout_EDX_15;
  socklen_t extraout_EDX_16;
  socklen_t extraout_EDX_17;
  socklen_t extraout_EDX_18;
  socklen_t extraout_EDX_19;
  socklen_t extraout_EDX_20;
  socklen_t extraout_EDX_21;
  undefined4 in_register_00000034;
  string *host;
  sockaddr_storage *name;
  string *psVar9;
  TransportTCP *pTVar10;
  _Alloc_hider _Var11;
  in_addr ina;
  string local_2a0;
  addrinfo *addr;
  undefined1 local_278 [32];
  char *local_258;
  addrinfo *paStack_250;
  in6_addr in6a;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  char local_218 [96];
  ios_base local_1b8 [264];
  sockaddr_storage sas;
  
  host = (string *)CONCAT44(in_register_00000034,__fd);
  bVar4 = Transport::isHostAllowed(&this->super_Transport,host);
  if (bVar4) {
    sVar8 = 0x2b8622;
    iVar5 = socket((uint)s_use_ipv6_ * 8 + 2,1,0);
    this->sock_ = iVar5;
    _Var11._M_p = (pointer)&this->connected_host_;
    psVar9 = host;
    std::__cxx11::string::_M_assign((string *)_Var11._M_p);
    this->connected_port_ = (int)__addr;
    if (this->sock_ == -1) {
      sVar8 = extraout_EDX;
      if (console::g_initialized == '\0') {
        console::initialize();
        sVar8 = extraout_EDX_04;
      }
      if (connect::loc.initialized_ == false) {
        _ss = (pointer)&local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"miniros.transport_tcp","");
        psVar9 = (string *)&ss;
        console::initializeLogLocation(&connect::loc,psVar9,Error);
        _Var11._M_p = _ss;
        sVar8 = extraout_EDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss != &local_228) {
          psVar9 = (string *)(local_228._M_allocated_capacity + 1);
          operator_delete(_ss,(ulong)psVar9);
          sVar8 = extraout_EDX_06;
        }
      }
      iVar5 = (int)_Var11._M_p;
      if (connect::loc.level_ != Error) {
        connect(iVar5,(sockaddr *)psVar9,sVar8);
        sVar8 = extraout_EDX_07;
      }
      if (connect::loc.logger_enabled_ == true) {
        connect(iVar5,(sockaddr *)psVar9,sVar8);
      }
    }
    else {
      __addr_00 = &this->sock_;
      setNonBlocking(this);
      iVar5 = inet_pton(2,(host->_M_dataplus)._M_p,&ina);
      uVar3 = (ushort)__addr;
      if (iVar5 == 1) {
        this->la_len_ = 0x10;
        sas.ss_family = 2;
        sas.__ss_padding._0_2_ = uVar3 << 8 | uVar3 >> 8;
        sas.__ss_padding[2] = (undefined1)ina.s_addr;
        sas.__ss_padding[3] = ina.s_addr._1_1_;
        sas.__ss_padding[4] = ina.s_addr._2_1_;
        sas.__ss_padding[5] = ina.s_addr._3_1_;
        sVar8 = 0x10;
      }
      else {
        iVar5 = inet_pton(10,(host->_M_dataplus)._M_p,&in6a);
        if (iVar5 == 1) {
          this->la_len_ = 0x1c;
          sas.ss_family = 10;
          sas.__ss_padding._0_2_ = uVar3 << 8 | uVar3 >> 8;
          sas.__ss_padding[6] = in6a.__in6_u._0_1_;
          sas.__ss_padding[7] = in6a.__in6_u._1_1_;
          sas.__ss_padding[8] = in6a.__in6_u._2_1_;
          sas.__ss_padding[9] = in6a.__in6_u._3_1_;
          sas.__ss_padding[10] = in6a.__in6_u._4_1_;
          sas.__ss_padding[0xb] = in6a.__in6_u._5_1_;
          sas.__ss_padding[0xc] = in6a.__in6_u._6_1_;
          sas.__ss_padding[0xd] = in6a.__in6_u._7_1_;
          sas.__ss_padding[0xe] = in6a.__in6_u._8_1_;
          sas.__ss_padding[0xf] = in6a.__in6_u._9_1_;
          sas.__ss_padding[0x10] = in6a.__in6_u._10_1_;
          sas.__ss_padding[0x11] = in6a.__in6_u._11_1_;
          sas.__ss_padding[0x12] = in6a.__in6_u._12_1_;
          sas.__ss_padding[0x13] = in6a.__in6_u._13_1_;
          sas.__ss_padding[0x14] = in6a.__in6_u._14_1_;
          sas.__ss_padding[0x15] = in6a.__in6_u._15_1_;
          sVar8 = 0x1c;
        }
        else {
          local_258 = (char *)0x0;
          paStack_250 = (addrinfo *)0x0;
          local_278._16_8_ = 0;
          local_278._24_8_ = (sockaddr *)0x0;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = 0;
          psVar9 = (string *)0x0;
          iVar5 = getaddrinfo((host->_M_dataplus)._M_p,(char *)0x0,(addrinfo *)local_278,
                              (addrinfo **)&addr);
          if (iVar5 == 0) {
            local_218[0x50] = '\0';
            local_218[0x51] = '\0';
            local_218[0x52] = '\0';
            local_218[0x53] = '\0';
            local_218[0x54] = '\0';
            local_218[0x55] = '\0';
            local_218[0x56] = '\0';
            local_218[0x57] = '\0';
            local_218[0x58] = '\0';
            local_218[0x59] = '\0';
            local_218[0x5a] = '\0';
            local_218[0x5b] = '\0';
            local_218[0x5c] = '\0';
            local_218[0x5d] = '\0';
            local_218[0x5e] = '\0';
            local_218[0x5f] = '\0';
            local_218[0x40] = '\0';
            local_218[0x41] = '\0';
            local_218[0x42] = '\0';
            local_218[0x43] = '\0';
            local_218[0x44] = '\0';
            local_218[0x45] = '\0';
            local_218[0x46] = '\0';
            local_218[0x47] = '\0';
            local_218[0x48] = '\0';
            local_218[0x49] = '\0';
            local_218[0x4a] = '\0';
            local_218[0x4b] = '\0';
            local_218[0x4c] = '\0';
            local_218[0x4d] = '\0';
            local_218[0x4e] = '\0';
            local_218[0x4f] = '\0';
            local_218[0x30] = '\0';
            local_218[0x31] = '\0';
            local_218[0x32] = '\0';
            local_218[0x33] = '\0';
            local_218[0x34] = '\0';
            local_218[0x35] = '\0';
            local_218[0x36] = '\0';
            local_218[0x37] = '\0';
            local_218[0x38] = '\0';
            local_218[0x39] = '\0';
            local_218[0x3a] = '\0';
            local_218[0x3b] = '\0';
            local_218[0x3c] = '\0';
            local_218[0x3d] = '\0';
            local_218[0x3e] = '\0';
            local_218[0x3f] = '\0';
            local_218[0x20] = '\0';
            local_218[0x21] = '\0';
            local_218[0x22] = '\0';
            local_218[0x23] = '\0';
            local_218[0x24] = '\0';
            local_218[0x25] = '\0';
            local_218[0x26] = '\0';
            local_218[0x27] = '\0';
            local_218[0x28] = '\0';
            local_218[0x29] = '\0';
            local_218[0x2a] = '\0';
            local_218[0x2b] = '\0';
            local_218[0x2c] = '\0';
            local_218[0x2d] = '\0';
            local_218[0x2e] = '\0';
            local_218[0x2f] = '\0';
            local_218[0x10] = '\0';
            local_218[0x11] = '\0';
            local_218[0x12] = '\0';
            local_218[0x13] = '\0';
            local_218[0x14] = '\0';
            local_218[0x15] = '\0';
            local_218[0x16] = '\0';
            local_218[0x17] = '\0';
            local_218[0x18] = '\0';
            local_218[0x19] = '\0';
            local_218[0x1a] = '\0';
            local_218[0x1b] = '\0';
            local_218[0x1c] = '\0';
            local_218[0x1d] = '\0';
            local_218[0x1e] = '\0';
            local_218[0x1f] = '\0';
            local_218[0] = '\0';
            local_218[1] = '\0';
            local_218[2] = '\0';
            local_218[3] = '\0';
            local_218[4] = '\0';
            local_218[5] = '\0';
            local_218[6] = '\0';
            local_218[7] = '\0';
            local_218[8] = '\0';
            local_218[9] = '\0';
            local_218[10] = '\0';
            local_218[0xb] = '\0';
            local_218[0xc] = '\0';
            local_218[0xd] = '\0';
            local_218[0xe] = '\0';
            local_218[0xf] = '\0';
            local_228._M_allocated_capacity = 0;
            local_228._8_8_ = 0;
            _ss = (pointer)0x0;
            for (paVar2 = addr; bVar4 = paVar2 != (addrinfo *)0x0, sVar8 = 0x2b8622, bVar4;
                paVar2 = paVar2->ai_next) {
              if (s_use_ipv6_ == 0) {
                if (paVar2->ai_family == 2) {
                  memcpy(&sas,paVar2->ai_addr,(ulong)paVar2->ai_addrlen);
                  sas.ss_family = (sa_family_t)paVar2->ai_family;
                  sas.__ss_padding._0_2_ = uVar3 << 8 | uVar3 >> 8;
                  psVar9 = (string *)inet_ntoa((in_addr)sas.__ss_padding._2_4_);
                  strncpy((char *)&ss,(char *)psVar9,0x7f);
                  sVar8 = 0x10;
                  break;
                }
              }
              else if (paVar2->ai_family == 10) {
                memcpy(&sas,paVar2->ai_addr,(ulong)paVar2->ai_addrlen);
                sas.ss_family = (sa_family_t)paVar2->ai_family;
                sas.__ss_padding._0_2_ = uVar3 << 8 | uVar3 >> 8;
                psVar9 = (string *)(sas.__ss_padding + 6);
                inet_ntop(10,psVar9,(char *)&ss,0x80);
                sVar8 = 0x1c;
                break;
              }
            }
            freeaddrinfo((addrinfo *)addr);
            iVar5 = (int)addr;
            if (bVar4) {
              sVar6 = extraout_EDX_01;
              if (console::g_initialized == '\0') {
                console::initialize();
                sVar6 = extraout_EDX_15;
              }
              if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2a0,"miniros.transport_tcp","");
                psVar9 = &local_2a0;
                console::initializeLogLocation
                          (&connect(std::__cxx11::string_const&,int)::loc,psVar9,Debug);
                _Var11._M_p = local_2a0._M_dataplus._M_p;
                sVar6 = extraout_EDX_16;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  psVar9 = (string *)(local_2a0.field_2._M_allocated_capacity + 1);
                  operator_delete(local_2a0._M_dataplus._M_p,(ulong)psVar9);
                  sVar6 = extraout_EDX_17;
                }
                iVar5 = (int)_Var11._M_p;
              }
              if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
                connect(iVar5,(sockaddr *)psVar9,sVar6);
              }
              if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
                connect(__fd,(sockaddr *)__addr_00,(socklen_t)&ss);
              }
            }
            else {
              sVar6 = extraout_EDX_01;
              if (console::g_initialized == '\0') {
                console::initialize();
                sVar6 = extraout_EDX_18;
              }
              if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2a0,"miniros.transport_tcp","");
                psVar9 = &local_2a0;
                console::initializeLogLocation
                          (&connect(std::__cxx11::string_const&,int)::loc,psVar9,Error);
                _Var11._M_p = local_2a0._M_dataplus._M_p;
                sVar6 = extraout_EDX_19;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  psVar9 = (string *)(local_2a0.field_2._M_allocated_capacity + 1);
                  operator_delete(local_2a0._M_dataplus._M_p,(ulong)psVar9);
                  sVar6 = extraout_EDX_20;
                }
                iVar5 = (int)_Var11._M_p;
              }
              if (connect(std::__cxx11::string_const&,int)::loc.level_ != Error) {
                connect(iVar5,(sockaddr *)psVar9,sVar6);
                sVar6 = extraout_EDX_21;
              }
              if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
                connect(__fd,(sockaddr *)psVar9,sVar6);
              }
            }
          }
          else {
            pTVar10 = this;
            (*(this->super_Transport)._vptr_Transport[8])();
            iVar5 = (int)pTVar10;
            sVar6 = extraout_EDX_00;
            if (console::g_initialized == '\0') {
              console::initialize();
              sVar6 = extraout_EDX_11;
            }
            if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
              _ss = (pointer)&local_228;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&ss,"miniros.transport_tcp","");
              psVar9 = (string *)&ss;
              console::initializeLogLocation
                        (&connect(std::__cxx11::string_const&,int)::loc,psVar9,Error);
              _Var11._M_p = _ss;
              sVar6 = extraout_EDX_12;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_ss != &local_228) {
                psVar9 = (string *)(local_228._M_allocated_capacity + 1);
                operator_delete(_ss,(ulong)psVar9);
                sVar6 = extraout_EDX_13;
              }
              iVar5 = (int)_Var11._M_p;
            }
            if (connect(std::__cxx11::string_const&,int)::loc.level_ != Error) {
              connect(iVar5,(sockaddr *)psVar9,sVar6);
              sVar6 = extraout_EDX_14;
            }
            if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
              connect(__fd,(sockaddr *)psVar9,sVar6);
            }
            bVar4 = false;
          }
          if (!bVar4) {
            return 0;
          }
        }
      }
      _Var11._M_p = (pointer)(ulong)(uint)this->sock_;
      name = &sas;
      sVar6 = ::connect(this->sock_,(sockaddr *)name,sVar8);
      sVar8 = extraout_EDX_02;
      if ((((byte)this->flags_ & sVar6 != 0) == 0) &&
         (((this->flags_ & 1U) != 0 || sVar6 == 0 ||
          (iVar5 = last_socket_error(), sVar8 = extraout_EDX_03, iVar5 == 0x73)))) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_228._M_local_buf,(host->_M_dataplus)._M_p,
                            host->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(int)__addr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," on socket ",0xb);
        std::ostream::operator<<((ostream *)poVar7,*__addr_00);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&this->cached_remote_host_,(string *)local_278);
        pcVar1 = local_278 + 0x10;
        if ((pointer)local_278._0_8_ != pcVar1) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        bVar4 = initializeSocket(this);
        if (bVar4) {
          if ((this->flags_ & 1) == 0) {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
              local_278._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_278,"miniros.transport_tcp","");
              console::initializeLogLocation
                        (&connect(std::__cxx11::string_const&,int)::loc,(string *)local_278,Debug);
              if ((pointer)local_278._0_8_ != pcVar1) {
                operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
              }
            }
            if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
              console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Debug);
              console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
            }
            if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,connect(std::__cxx11::string_const&,int)::loc.logger_
                             ,connect(std::__cxx11::string_const&,int)::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                             ,0x16f,"bool miniros::TransportTCP::connect(const std::string &, int)",
                             "Async connect() in progress to [%s:%d] on socket [%d]",
                             (host->_M_dataplus)._M_p,(ulong)__addr & 0xffffffff,
                             (ulong)(uint)*__addr_00);
            }
          }
          else {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
              local_278._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_278,"miniros.transport_tcp","");
              console::initializeLogLocation
                        (&connect(std::__cxx11::string_const&,int)::loc,(string *)local_278,Debug);
              if ((pointer)local_278._0_8_ != pcVar1) {
                operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
              }
            }
            if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
              console::setLogLocationLevel(&connect(std::__cxx11::string_const&,int)::loc,Debug);
              console::checkLogLocationEnabled(&connect(std::__cxx11::string_const&,int)::loc);
            }
            if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,connect(std::__cxx11::string_const&,int)::loc.logger_
                             ,connect(std::__cxx11::string_const&,int)::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                             ,0x16b,"bool miniros::TransportTCP::connect(const std::string &, int)",
                             "connect() succeeded to [%s:%d] on socket [%d]",
                             (host->_M_dataplus)._M_p,(ulong)__addr & 0xffffffff,
                             (ulong)(uint)*__addr_00);
            }
          }
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_1b8);
        return (int)CONCAT71(extraout_var,bVar4);
      }
      if (console::g_initialized == '\0') {
        console::initialize();
        sVar8 = extraout_EDX_08;
      }
      if (connect(std::__cxx11::string_const&,int)::loc.initialized_ == false) {
        _ss = (pointer)&local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"miniros.transport_tcp","");
        name = (sockaddr_storage *)&ss;
        console::initializeLogLocation
                  (&connect(std::__cxx11::string_const&,int)::loc,(string *)name,Debug);
        _Var11._M_p = _ss;
        sVar8 = extraout_EDX_09;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss != &local_228) {
          name = (sockaddr_storage *)(local_228._M_allocated_capacity + 1);
          operator_delete(_ss,(ulong)name);
          sVar8 = extraout_EDX_10;
        }
      }
      if (connect(std::__cxx11::string_const&,int)::loc.level_ != Debug) {
        connect((int)_Var11._M_p,(sockaddr *)name,sVar8);
      }
      if (connect(std::__cxx11::string_const&,int)::loc.logger_enabled_ == true) {
        connect(__fd,(sockaddr *)((ulong)__addr & 0xffffffff),sVar6);
      }
      (*(this->super_Transport)._vptr_Transport[8])(this);
    }
  }
  return 0;
}

Assistant:

bool TransportTCP::connect(const std::string& host, int port)
{
  if (!isHostAllowed(host))
    return false; // adios amigo

  sock_ = socket(s_use_ipv6_ ? AF_INET6 : AF_INET, SOCK_STREAM, 0);
  connected_host_ = host;
  connected_port_ = port;

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]",  last_socket_error_string());
    return false;
  }

  setNonBlocking();

  sockaddr_storage sas;
  socklen_t sas_len;

  in_addr ina;
  in6_addr in6a;
  if (inet_pton(AF_INET, host.c_str(), &ina) == 1)
  {
    sockaddr_in *address = (sockaddr_in*) &sas;
    sas_len = sizeof(sockaddr_in);
    
    la_len_ = sizeof(sockaddr_in);
    address->sin_family = AF_INET;
    address->sin_port = htons(port);
    address->sin_addr.s_addr = ina.s_addr;
  }
  else if (inet_pton(AF_INET6, host.c_str(), &in6a) == 1)
  {
    sockaddr_in6 *address = (sockaddr_in6*) &sas;
    sas_len = sizeof(sockaddr_in6);
    la_len_ = sizeof(sockaddr_in6);
    address->sin6_family = AF_INET6;
    address->sin6_port = htons(port);
    memcpy(address->sin6_addr.s6_addr, in6a.s6_addr, sizeof(in6a.s6_addr));
  }
  else
  {
    struct addrinfo* addr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;

    if (getaddrinfo(host.c_str(), NULL, &hints, &addr) != 0)
    {
      close();
      MINIROS_ERROR("couldn't resolve publisher host [%s]", host.c_str());
      return false;
    }

    bool found = false;
    struct addrinfo* it = addr;
    char namebuf[128] = {};
    for (; it; it = it->ai_next)
    {
      if (!s_use_ipv6_ && it->ai_family == AF_INET)
      {
        sockaddr_in *address = (sockaddr_in*) &sas;
        sas_len = sizeof(*address);
        
        memcpy(address, it->ai_addr, it->ai_addrlen);
        address->sin_family = it->ai_family;
        address->sin_port = htons(port);
	
        strncpy(namebuf, inet_ntoa(address->sin_addr), sizeof(namebuf)-1);
        found = true;
        break;
      }
      if (s_use_ipv6_ && it->ai_family == AF_INET6)
      {
        sockaddr_in6 *address = (sockaddr_in6*) &sas;
        sas_len = sizeof(*address);
      
        memcpy(address, it->ai_addr, it->ai_addrlen);
        address->sin6_family = it->ai_family;
        address->sin6_port = htons((u_short) port);
      
        // TODO IPV6: does inet_ntop need other includes for Windows?
        inet_ntop(AF_INET6, (void*)&(address->sin6_addr), namebuf, sizeof(namebuf));
        found = true;
        break;
      }
    }

    freeaddrinfo(addr);

    if (!found)
    {
      MINIROS_ERROR("Couldn't resolve an address for [%s]\n", host.c_str());
      return false;
    }

    MINIROS_DEBUG("Resolved publisher host [%s] to [%s] for socket [%d]", host.c_str(), namebuf, sock_);
  }

  int ret = ::connect(sock_, (sockaddr*) &sas, sas_len);
  // windows might need some time to sleep (input from service robotics hack) add this if testing proves it is necessary.
  // MINIROS_ASSERT((flags_ & SYNCHRONOUS) || ret != 0);
  if (((flags_ & SYNCHRONOUS) && ret != 0) || // synchronous, connect() should return 0
      (!(flags_ & SYNCHRONOUS) && ret != 0 && last_socket_error() != ROS_SOCKETS_ASYNCHRONOUS_CONNECT_RETURN)) 
      // asynchronous, connect() may return 0 or -1. When return -1, WSAGetLastError()=WSAEWOULDBLOCK/errno=EINPROGRESS
  {
    MINIROS_DEBUG("Connect to tcpros publisher [%s:%d] failed with error [%d, %s]", host.c_str(), port, ret, last_socket_error_string());
    close();

    return false;
  }

  // from daniel stonier:
#ifdef WIN32
  // This is hackish, but windows fails at recv() if its slow to connect (e.g. happens with wireless)
  // recv() needs to check if its connected or not when its asynchronous?
  Sleep(100);
#endif


  std::stringstream ss;
  ss << host << ":" << port << " on socket " << sock_;
  cached_remote_host_ = ss.str();

  if (!initializeSocket())
  {
    return false;
  }

  if (flags_ & SYNCHRONOUS)
  {
    MINIROS_DEBUG("connect() succeeded to [%s:%d] on socket [%d]", host.c_str(), port, sock_);
  }
  else
  {
    MINIROS_DEBUG("Async connect() in progress to [%s:%d] on socket [%d]", host.c_str(), port, sock_);
  }

  return true;
}